

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O2

ostream * deqp::ub::operator<<(ostream *stream,BlockLayoutEntry *entry)

{
  ostream *poVar1;
  int *piVar2;
  
  poVar1 = std::operator<<(stream,(string *)entry);
  poVar1 = std::operator<<(poVar1," { name = ");
  poVar1 = std::operator<<(poVar1,(string *)entry);
  poVar1 = std::operator<<(poVar1,", size = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,entry->size);
  std::operator<<(poVar1,", activeUniformIndices = [");
  for (piVar2 = (entry->activeUniformIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar2 != (entry->activeUniformIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish; piVar2 = piVar2 + 1) {
    if (piVar2 != (entry->activeUniformIndices).super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
      std::operator<<(stream,", ");
    }
    std::ostream::operator<<(stream,*piVar2);
  }
  std::operator<<(stream,"] }");
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const BlockLayoutEntry& entry)
{
	stream << entry.name << " { name = " << entry.name << ", size = " << entry.size << ", activeUniformIndices = [";

	for (vector<int>::const_iterator i = entry.activeUniformIndices.begin(); i != entry.activeUniformIndices.end(); i++)
	{
		if (i != entry.activeUniformIndices.begin())
			stream << ", ";
		stream << *i;
	}

	stream << "] }";
	return stream;
}